

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd_internals.h
# Opt level: O3

sec_shard_t * sec_shard_pick(tsdn_t *tsdn,sec_t *sec)

{
  byte bVar1;
  ulong uVar2;
  
  if (tsdn != (tsdn_t *)0x0) {
    bVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_sec_shard;
    if (bVar1 == 0xff) {
      uVar2 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
              0x5851f42d4c957f2d + 0x14057b7ef767814f;
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar2;
      bVar1 = (byte)((uVar2 >> 0x20) * (sec->opts).nshards >> 0x20);
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_sec_shard = bVar1;
    }
    return (sec_shard_t *)((long)&(sec->shards->mtx).field_0 + (ulong)((uint)bVar1 * 0x90));
  }
  return sec->shards;
}

Assistant:

JEMALLOC_ALWAYS_INLINE bool
tsdn_null(const tsdn_t *tsdn) {
	return tsdn == NULL;
}